

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O3

_ElementType __thiscall
Inferences::AcyclicityGIE1::SubtermDisequalityIterator::next(SubtermDisequalityIterator *this)

{
  TermList **ppTVar1;
  TermList arg1;
  Literal *a;
  Literal *b;
  Clause *pCVar2;
  GeneratingInference1 local_60;
  Inference local_50;
  
  ppTVar1 = (this->_subterms)._cursor;
  arg1._content =
       *(uint64_t *)
        ((long)this->_lit +
        ((ulong)(*(uint *)&(this->_lit->super_Term).field_0xc & 0xfffffff) -
        ((ulong)this->_leftSide ^ 1)) * 8 + 0x28);
  (this->_subterms)._cursor = ppTVar1 + -1;
  b = Kernel::Literal::createEquality
                (false,arg1,(TermList)ppTVar1[-1]->_content,(TermList)(this->_sort)._content);
  pCVar2 = this->_clause;
  a = this->_lit;
  local_60.rule = TERM_ALGEBRA_ACYCLICITY;
  local_60.premise = pCVar2;
  Kernel::Inference::Inference(&local_50,&local_60);
  pCVar2 = replaceLit(pCVar2,a,b,&local_50);
  *(int *)(DAT_00b521c0 + 0x1cc) = *(int *)(DAT_00b521c0 + 0x1cc) + 1;
  return pCVar2;
}

Assistant:

OWN_ELEMENT_TYPE next()
    {
      Literal *newlit = Literal::createEquality(false,
                                                *_lit->nthArgument(_leftSide ? 0 : 1),
                                                *_subterms.pop(),
                                                _sort);
      Clause* res = replaceLit(_clause, _lit, newlit, GeneratingInference1(InferenceRule::TERM_ALGEBRA_ACYCLICITY, _clause));
      env.statistics->taAcyclicityGeneratedDisequalities++;
      return res;
    }